

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.cc
# Opt level: O2

int __thiscall
webrtc::Resampler::Push
          (Resampler *this,int16_t *samplesIn,size_t lengthIn,int16_t *samplesOut,size_t maxLen,
          size_t *outLen)

{
  int iVar1;
  int iVar2;
  size_t i;
  int16_t *piVar3;
  int16_t *piVar4;
  int16_t *samplesOut_00;
  int16_t *samplesOut_01;
  ulong uVar5;
  int32_t *piVar6;
  int32_t *piVar7;
  int32_t *piVar8;
  int iVar9;
  size_t sVar10;
  size_t i_8;
  size_t i_2;
  size_t i_10;
  size_t i_3;
  size_t i_12;
  ulong uVar11;
  size_t i_6;
  ulong uVar12;
  int32_t *local_68;
  size_t actualOutLen_right;
  size_t actualOutLen_left;
  
  if (this->num_channels_ == 2) {
    piVar3 = (int16_t *)malloc(lengthIn & 0x7fffffffffffffff);
    piVar4 = (int16_t *)malloc(lengthIn & 0x7fffffffffffffff);
    samplesOut_00 = (int16_t *)malloc(maxLen & 0xfffffffffffffffe);
    samplesOut_01 = (int16_t *)malloc(maxLen & 0xfffffffffffffffe);
    for (uVar5 = 0; uVar5 < lengthIn; uVar5 = uVar5 + 2) {
      *(int16_t *)((long)piVar3 + uVar5) = samplesIn[uVar5];
      *(int16_t *)((long)piVar4 + uVar5) = samplesIn[uVar5 + 1];
    }
    actualOutLen_left = 0;
    actualOutLen_right = 0;
    iVar1 = Push(this->slave_left_,piVar3,lengthIn >> 1,samplesOut_00,maxLen >> 1,&actualOutLen_left
                );
    iVar2 = Push(this->slave_right_,piVar4,lengthIn >> 1,samplesOut_01,maxLen >> 1,
                 &actualOutLen_right);
    iVar9 = -1;
    if ((iVar2 == 0 && iVar1 == 0) && (actualOutLen_left == actualOutLen_right)) {
      for (sVar10 = 0; actualOutLen_left != sVar10; sVar10 = sVar10 + 1) {
        samplesOut[sVar10 * 2] = samplesOut_00[sVar10];
        samplesOut[sVar10 * 2 + 1] = samplesOut_01[sVar10];
      }
      *outLen = actualOutLen_left * 2;
      iVar9 = 0;
    }
    free(piVar3);
    free(piVar4);
    free(samplesOut_00);
    free(samplesOut_01);
    return iVar9;
  }
  switch(this->my_mode_) {
  case kResamplerMode1To1:
    memcpy(samplesOut,samplesIn,lengthIn * 2);
    *outLen = lengthIn;
    return 0;
  case kResamplerMode1To2:
    uVar5 = lengthIn * 2;
    if (maxLen < uVar5) {
      return -1;
    }
    WebRtcSpl_UpsampleBy2(samplesIn,lengthIn,samplesOut,(int32_t *)this->state1_);
    goto LAB_0014f3cd;
  case kResamplerMode1To3:
    if (lengthIn % 0xa0 != 0) {
      return -1;
    }
    if (maxLen < lengthIn * 3) {
      return -1;
    }
    piVar6 = (int32_t *)malloc(0x540);
    for (uVar5 = 0; uVar5 < lengthIn; uVar5 = uVar5 + 0xa0) {
      WebRtcSpl_Resample16khzTo48khz
                (samplesIn,samplesOut,(WebRtcSpl_State16khzTo48khz *)this->state1_,piVar6);
      samplesOut = samplesOut + 0x1e0;
      samplesIn = samplesIn + 0xa0;
    }
    *outLen = lengthIn * 3;
    break;
  case kResamplerMode1To4:
    uVar5 = lengthIn * 4;
    if (maxLen <= uVar5 && uVar5 - maxLen != 0) {
      return -1;
    }
    piVar6 = (int32_t *)malloc(uVar5);
    WebRtcSpl_UpsampleBy2(samplesIn,lengthIn,(int16_t *)piVar6,(int32_t *)this->state1_);
    WebRtcSpl_UpsampleBy2((int16_t *)piVar6,lengthIn * 2,samplesOut,(int32_t *)this->state2_);
    *outLen = uVar5;
    break;
  case kResamplerMode1To6:
    if (lengthIn % 0x50 != 0) {
      return -1;
    }
    if (maxLen <= lengthIn * 6 && lengthIn * 6 - maxLen != 0) {
      return -1;
    }
    piVar7 = (int32_t *)malloc(0x540);
    local_68 = (int32_t *)malloc(lengthIn * 4);
    WebRtcSpl_UpsampleBy2(samplesIn,lengthIn,(int16_t *)local_68,(int32_t *)this->state1_);
    sVar10 = lengthIn * 2;
    *outLen = sVar10;
    piVar6 = local_68;
    for (uVar5 = 0; uVar5 < sVar10; uVar5 = uVar5 + 0xa0) {
      WebRtcSpl_Resample16khzTo48khz
                ((int16_t *)piVar6,samplesOut,(WebRtcSpl_State16khzTo48khz *)this->state2_,piVar7);
      sVar10 = *outLen;
      samplesOut = samplesOut + 0x1e0;
      piVar6 = piVar6 + 0x50;
    }
    *outLen = sVar10 * 3;
    goto LAB_0014fa2c;
  case kResamplerMode1To12:
    if (lengthIn % 0x28 != 0) {
      return -1;
    }
    if (maxLen <= lengthIn * 0xc && lengthIn * 0xc - maxLen != 0) {
      return -1;
    }
    piVar7 = (int32_t *)malloc(0x540);
    local_68 = (int32_t *)malloc(lengthIn * 8);
    WebRtcSpl_UpsampleBy2(samplesIn,lengthIn,samplesOut,(int32_t *)this->state1_);
    *outLen = lengthIn * 2;
    WebRtcSpl_UpsampleBy2(samplesOut,lengthIn * 2,(int16_t *)local_68,(int32_t *)this->state2_);
    uVar5 = *outLen * 2;
    *outLen = uVar5;
    piVar6 = local_68;
    for (uVar12 = 0; uVar12 < uVar5; uVar12 = uVar12 + 0xa0) {
      WebRtcSpl_Resample16khzTo48khz
                ((int16_t *)piVar6,samplesOut,(WebRtcSpl_State16khzTo48khz *)this->state3_,piVar7);
      uVar5 = *outLen;
      samplesOut = samplesOut + 0x1e0;
      piVar6 = piVar6 + 0x50;
    }
    *outLen = uVar5 * 3;
    goto LAB_0014fa2c;
  case kResamplerMode2To3:
    uVar5 = lengthIn * 3 >> 1;
    if (lengthIn % 0xa0 != 0 || maxLen < uVar5) {
      return -1;
    }
    piVar7 = (int32_t *)malloc(lengthIn * 6);
    piVar6 = (int32_t *)malloc(0x540);
    piVar8 = piVar7;
    for (uVar12 = 0; uVar12 < lengthIn; uVar12 = uVar12 + 0xa0) {
      WebRtcSpl_Resample16khzTo48khz
                (samplesIn,(int16_t *)piVar8,(WebRtcSpl_State16khzTo48khz *)this->state1_,piVar6);
      piVar8 = piVar8 + 0xf0;
      samplesIn = samplesIn + 0xa0;
    }
    WebRtcSpl_DownsampleBy2((int16_t *)piVar7,lengthIn * 3,samplesOut,(int32_t *)this->state2_);
    *outLen = uVar5;
    goto LAB_0014fa7c;
  case kResamplerMode2To11:
    if (lengthIn % 0x50 != 0) {
      return -1;
    }
    if (maxLen < lengthIn * 0xb >> 1) {
      return -1;
    }
    local_68 = (int32_t *)malloc(lengthIn * 4);
    WebRtcSpl_UpsampleBy2(samplesIn,lengthIn,(int16_t *)local_68,(int32_t *)this->state1_);
    piVar7 = (int32_t *)malloc(0x188);
    uVar12 = 0;
    piVar6 = local_68;
    for (uVar5 = 0; uVar5 < lengthIn * 2; uVar5 = uVar5 + 0x50) {
      WebRtcSpl_Resample8khzTo22khz
                ((int16_t *)piVar6,(int16_t *)((uVar12 >> 1) + (long)samplesOut),
                 (WebRtcSpl_State8khzTo22khz *)this->state2_,piVar7);
      piVar6 = piVar6 + 0x28;
      uVar12 = uVar12 + 0x370;
    }
    *outLen = lengthIn * 0x16 >> 2;
LAB_0014fa2c:
    free(piVar7);
    piVar6 = local_68;
    break;
  case kResamplerMode4To11:
    if (lengthIn % 0x50 != 0) {
      return -1;
    }
    local_68 = (int32_t *)(lengthIn * 0xb >> 2);
    if (maxLen < local_68) {
      return -1;
    }
    piVar6 = (int32_t *)malloc(0x188);
    uVar12 = 0;
    for (uVar5 = 0; uVar5 < lengthIn; uVar5 = uVar5 + 0x50) {
      WebRtcSpl_Resample8khzTo22khz
                (samplesIn,(int16_t *)((uVar12 >> 1) + (long)samplesOut),
                 (WebRtcSpl_State8khzTo22khz *)this->state1_,piVar6);
      samplesIn = samplesIn + 0x50;
      uVar12 = uVar12 + 0x370;
    }
    goto LAB_0014fa37;
  case kResamplerMode8To11:
    if (lengthIn % 0xa0 != 0) {
      return -1;
    }
    local_68 = (int32_t *)(lengthIn * 0xb >> 3);
    if (maxLen < local_68) {
      return -1;
    }
    piVar6 = (int32_t *)malloc(0x160);
    uVar12 = 0;
    for (uVar5 = 0; uVar5 < lengthIn; uVar5 = uVar5 + 0xa0) {
      WebRtcSpl_Resample16khzTo22khz
                (samplesIn,(int16_t *)((uVar12 >> 2) + (long)samplesOut),
                 (WebRtcSpl_State16khzTo22khz *)this->state1_,piVar6);
      samplesIn = samplesIn + 0xa0;
      uVar12 = uVar12 + 0x6e0;
    }
LAB_0014fa37:
    *outLen = (size_t)local_68;
    break;
  case kResamplerMode11To16:
    if (lengthIn % 0x6e != 0) {
      return -1;
    }
    uVar5 = (lengthIn << 4) / 0xb;
    if (maxLen < uVar5) {
      return -1;
    }
    piVar8 = (int32_t *)malloc(0x1a0);
    piVar6 = (int32_t *)malloc(lengthIn * 4);
    WebRtcSpl_UpsampleBy2(samplesIn,lengthIn,(int16_t *)piVar6,(int32_t *)this->state1_);
    piVar7 = piVar6;
    for (uVar12 = 0; uVar12 < lengthIn * 2; uVar12 = uVar12 + 0xdc) {
      WebRtcSpl_Resample22khzTo16khz
                ((int16_t *)piVar7,samplesOut + (uVar12 / 0xdc) * 0xa0,
                 (WebRtcSpl_State22khzTo16khz *)this->state2_,piVar8);
      piVar7 = piVar7 + 0x6e;
    }
    *outLen = uVar5;
    free(piVar8);
    break;
  case kResamplerMode11To32:
    if (lengthIn % 0x6e != 0) {
      return -1;
    }
    uVar5 = (lengthIn << 5) / 0xb;
    if (maxLen < uVar5) {
      return -1;
    }
    piVar7 = (int32_t *)malloc(0x1a0);
    piVar6 = (int32_t *)malloc(lengthIn * 4);
    WebRtcSpl_UpsampleBy2(samplesIn,lengthIn,samplesOut,(int32_t *)this->state1_);
    piVar3 = samplesOut;
    for (uVar12 = 0; uVar12 < lengthIn * 2; uVar12 = uVar12 + 0xdc) {
      WebRtcSpl_Resample22khzTo16khz
                (piVar3,(int16_t *)(piVar6 + (uVar12 / 0xdc) * 0x50),
                 (WebRtcSpl_State22khzTo16khz *)this->state2_,piVar7);
      piVar3 = piVar3 + 0xdc;
    }
    WebRtcSpl_UpsampleBy2
              ((int16_t *)piVar6,(lengthIn << 4) / 0xb,samplesOut,(int32_t *)this->state3_);
    *outLen = uVar5;
LAB_0014fa7c:
    free(piVar7);
    break;
  case kResamplerMode2To1:
    uVar5 = lengthIn >> 1;
    if (maxLen < uVar5) {
      return -1;
    }
    WebRtcSpl_DownsampleBy2(samplesIn,lengthIn,samplesOut,(int32_t *)this->state1_);
LAB_0014f3cd:
    *outLen = uVar5;
    return 0;
  case kResamplerMode3To1:
    if (lengthIn % 0x1e0 != 0) {
      return -1;
    }
    local_68 = (int32_t *)(lengthIn / 3);
    if (maxLen < local_68) {
      return -1;
    }
    piVar6 = (int32_t *)malloc(0x7c0);
    for (uVar5 = 0; uVar5 < lengthIn; uVar5 = uVar5 + 0x1e0) {
      WebRtcSpl_Resample48khzTo16khz
                (samplesIn,samplesOut + uVar5 / 3,(WebRtcSpl_State48khzTo16khz *)this->state1_,
                 piVar6);
      samplesIn = samplesIn + 0x1e0;
    }
    goto LAB_0014f922;
  case kResamplerMode4To1:
    if (maxLen < lengthIn >> 2) {
      return -1;
    }
    piVar6 = (int32_t *)malloc(lengthIn & 0x7fffffffffffffff);
    WebRtcSpl_DownsampleBy2(samplesIn,lengthIn,(int16_t *)piVar6,(int32_t *)this->state1_);
    WebRtcSpl_DownsampleBy2((int16_t *)piVar6,lengthIn >> 1,samplesOut,(int32_t *)this->state2_);
    *outLen = lengthIn >> 2;
    break;
  case kResamplerMode6To1:
    if (lengthIn % 0x1e0 != 0) {
      return -1;
    }
    if (lengthIn / 6 <= maxLen) {
      piVar6 = (int32_t *)malloc(0x7c0);
      piVar3 = (int16_t *)malloc((lengthIn * 2) / 3);
      for (uVar5 = 0; uVar5 < lengthIn; uVar5 = uVar5 + 0x1e0) {
        WebRtcSpl_Resample48khzTo16khz
                  (samplesIn,piVar3 + uVar5 / 3,(WebRtcSpl_State48khzTo16khz *)this->state1_,piVar6)
        ;
        samplesIn = samplesIn + 0x1e0;
      }
      *outLen = lengthIn / 3;
      free(piVar6);
      WebRtcSpl_DownsampleBy2(piVar3,lengthIn / 3,samplesOut,(int32_t *)this->state2_);
      free(piVar3);
      *outLen = *outLen >> 1;
      return 0;
    }
    return -1;
  case kResamplerMode12To1:
    if (lengthIn % 0x1e0 != 0) {
      return -1;
    }
    if (lengthIn / 0xc <= maxLen) {
      piVar6 = (int32_t *)malloc(0x7c0);
      piVar3 = (int16_t *)malloc((lengthIn * 2) / 3);
      piVar4 = (int16_t *)malloc((lengthIn * 2) / 6);
      for (uVar5 = 0; uVar5 < lengthIn; uVar5 = uVar5 + 0x1e0) {
        WebRtcSpl_Resample48khzTo16khz
                  (samplesIn,piVar3 + uVar5 / 3,(WebRtcSpl_State48khzTo16khz *)this->state1_,piVar6)
        ;
        samplesIn = samplesIn + 0x1e0;
      }
      *outLen = lengthIn / 3;
      free(piVar6);
      WebRtcSpl_DownsampleBy2(piVar3,lengthIn / 3,piVar4,(int32_t *)this->state2_);
      uVar5 = *outLen;
      *outLen = uVar5 >> 1;
      free(piVar3);
      WebRtcSpl_DownsampleBy2(piVar4,uVar5 >> 1,samplesOut,(int32_t *)this->state3_);
      free(piVar4);
      *outLen = *outLen >> 1;
      return 0;
    }
    return -1;
  case kResamplerMode3To2:
    uVar5 = lengthIn * 2;
    if (maxLen < uVar5 / 3) {
      return -1;
    }
    piVar3 = (int16_t *)malloc(lengthIn * 4);
    WebRtcSpl_UpsampleBy2(samplesIn,lengthIn,piVar3,(int32_t *)this->state1_);
    if (uVar5 % 0x1e0 != 0) {
      free(piVar3);
      return -1;
    }
    piVar6 = (int32_t *)malloc(0x7c0);
    piVar4 = piVar3;
    for (uVar12 = 0; uVar12 < uVar5; uVar12 = uVar12 + 0x1e0) {
      WebRtcSpl_Resample48khzTo16khz
                (piVar4,samplesOut + uVar12 / 3,(WebRtcSpl_State48khzTo16khz *)this->state2_,piVar6)
      ;
      piVar4 = piVar4 + 0x1e0;
    }
    *outLen = uVar5 / 3;
    free(piVar3);
    break;
  case kResamplerMode11To2:
    if (lengthIn % 0xdc != 0) {
      return -1;
    }
    if (maxLen < (lengthIn * 2) / 0xb) {
      return -1;
    }
    piVar7 = (int32_t *)malloc(0x1f8);
    uVar12 = 0;
    uVar5 = (lengthIn * 4) / 0xb;
    piVar6 = (int32_t *)malloc(uVar5 * 2);
    for (uVar11 = 0; uVar11 < lengthIn; uVar11 = uVar11 + 0xdc) {
      WebRtcSpl_Resample22khzTo8khz
                (samplesIn,(int16_t *)((long)piVar6 + (uVar12 / 0xb) * 2),
                 (WebRtcSpl_State22khzTo8khz *)this->state1_,piVar7);
      uVar12 = uVar12 + 0x370;
      samplesIn = samplesIn + 0xdc;
    }
    WebRtcSpl_DownsampleBy2((int16_t *)piVar6,uVar5,samplesOut,(int32_t *)this->state2_);
    *outLen = (lengthIn * 4) / 0x16;
    free(piVar7);
    break;
  case kResamplerMode11To4:
    if (lengthIn % 0xdc != 0) {
      return -1;
    }
    local_68 = (int32_t *)((lengthIn * 4) / 0xb);
    if (maxLen < local_68) {
      return -1;
    }
    piVar6 = (int32_t *)malloc(0x1f8);
    uVar12 = 0;
    for (uVar5 = 0; uVar5 < lengthIn; uVar5 = uVar5 + 0xdc) {
      WebRtcSpl_Resample22khzTo8khz
                (samplesIn,samplesOut + uVar12 / 0xb,(WebRtcSpl_State22khzTo8khz *)this->state1_,
                 piVar6);
      uVar12 = uVar12 + 0x370;
      samplesIn = samplesIn + 0xdc;
    }
    goto LAB_0014f922;
  case kResamplerMode11To8:
    if (lengthIn % 0xdc != 0) {
      return -1;
    }
    local_68 = (int32_t *)((lengthIn * 8) / 0xb);
    if (maxLen < local_68) {
      return -1;
    }
    piVar6 = (int32_t *)malloc(0x1a0);
    uVar12 = 0;
    for (uVar5 = 0; uVar5 < lengthIn; uVar5 = uVar5 + 0xdc) {
      WebRtcSpl_Resample22khzTo16khz
                (samplesIn,samplesOut + uVar12 / 0xb,(WebRtcSpl_State22khzTo16khz *)this->state1_,
                 piVar6);
      uVar12 = uVar12 + 0x6e0;
      samplesIn = samplesIn + 0xdc;
    }
LAB_0014f922:
    *outLen = (size_t)local_68;
    break;
  default:
    goto switchD_0014ee0a_default;
  }
  free(piVar6);
switchD_0014ee0a_default:
  return 0;
}

Assistant:

int Resampler::Push(const int16_t * samplesIn, size_t lengthIn,
                    int16_t* samplesOut, size_t maxLen, size_t &outLen)
{
    if (num_channels_ == 2)
    {
        // Split up the signal and call the slave object for each channel
        int16_t* left = (int16_t*)malloc(lengthIn * sizeof(int16_t) / 2);
        int16_t* right = (int16_t*)malloc(lengthIn * sizeof(int16_t) / 2);
        int16_t* out_left = (int16_t*)malloc(maxLen / 2 * sizeof(int16_t));
        int16_t* out_right =
                (int16_t*)malloc(maxLen / 2 * sizeof(int16_t));
        int res = 0;
        for (size_t i = 0; i < lengthIn; i += 2)
        {
            left[i >> 1] = samplesIn[i];
            right[i >> 1] = samplesIn[i + 1];
        }

        // It's OK to overwrite the local parameter, since it's just a copy
        lengthIn = lengthIn / 2;

        size_t actualOutLen_left = 0;
        size_t actualOutLen_right = 0;
        // Do resampling for right channel
        res |= slave_left_->Push(left, lengthIn, out_left, maxLen / 2, actualOutLen_left);
        res |= slave_right_->Push(right, lengthIn, out_right, maxLen / 2, actualOutLen_right);
        if (res || (actualOutLen_left != actualOutLen_right))
        {
            free(left);
            free(right);
            free(out_left);
            free(out_right);
            return -1;
        }

        // Reassemble the signal
        for (size_t i = 0; i < actualOutLen_left; i++)
        {
            samplesOut[i * 2] = out_left[i];
            samplesOut[i * 2 + 1] = out_right[i];
        }
        outLen = 2 * actualOutLen_left;

        free(left);
        free(right);
        free(out_left);
        free(out_right);

        return 0;
    }

    // Containers for temp samples
    int16_t* tmp;
    int16_t* tmp_2;
    // tmp data for resampling routines
    int32_t* tmp_mem;

    switch (my_mode_)
    {
        case kResamplerMode1To1:
            memcpy(samplesOut, samplesIn, lengthIn * sizeof(int16_t));
            outLen = lengthIn;
            break;
        case kResamplerMode1To2:
            if (maxLen < (lengthIn * 2))
            {
                return -1;
            }
            WebRtcSpl_UpsampleBy2(samplesIn, lengthIn, samplesOut, (int32_t*)state1_);
            outLen = lengthIn * 2;
            return 0;
        case kResamplerMode1To3:

            // We can only handle blocks of 160 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 160) != 0)
            {
                return -1;
            }
            if (maxLen < (lengthIn * 3))
            {
                return -1;
            }
            tmp_mem = (int32_t*)malloc(336 * sizeof(int32_t));

            for (size_t i = 0; i < lengthIn; i += 160)
            {
                WebRtcSpl_Resample16khzTo48khz(samplesIn + i, samplesOut + i * 3,
                                               (WebRtcSpl_State16khzTo48khz *)state1_,
                                               tmp_mem);
            }
            outLen = lengthIn * 3;
            free(tmp_mem);
            return 0;
        case kResamplerMode1To4:
            if (maxLen < (lengthIn * 4))
            {
                return -1;
            }

            tmp = (int16_t*)malloc(sizeof(int16_t) * 2 * lengthIn);
            // 1:2
            WebRtcSpl_UpsampleBy2(samplesIn, lengthIn, tmp, (int32_t*)state1_);
            // 2:4
            WebRtcSpl_UpsampleBy2(tmp, lengthIn * 2, samplesOut, (int32_t*)state2_);
            outLen = lengthIn * 4;
            free(tmp);
            return 0;
        case kResamplerMode1To6:
            // We can only handle blocks of 80 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 80) != 0)
            {
                return -1;
            }
            if (maxLen < (lengthIn * 6))
            {
                return -1;
            }

            //1:2

            tmp_mem = (int32_t*)malloc(336 * sizeof(int32_t));
            tmp = (int16_t*)malloc(sizeof(int16_t) * 2 * lengthIn);

            WebRtcSpl_UpsampleBy2(samplesIn, lengthIn, tmp, (int32_t*)state1_);
            outLen = lengthIn * 2;

            for (size_t i = 0; i < outLen; i += 160)
            {
                WebRtcSpl_Resample16khzTo48khz(tmp + i, samplesOut + i * 3,
                                               (WebRtcSpl_State16khzTo48khz *)state2_,
                                               tmp_mem);
            }
            outLen = outLen * 3;
            free(tmp_mem);
            free(tmp);

            return 0;
        case kResamplerMode1To12:
            // We can only handle blocks of 40 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 40) != 0) {
              return -1;
            }
            if (maxLen < (lengthIn * 12)) {
              return -1;
            }

            tmp_mem = (int32_t*) malloc(336 * sizeof(int32_t));
            tmp = (int16_t*) malloc(sizeof(int16_t) * 4 * lengthIn);
            //1:2
            WebRtcSpl_UpsampleBy2(samplesIn, lengthIn, samplesOut,
                                  (int32_t*) state1_);
            outLen = lengthIn * 2;
            //2:4
            WebRtcSpl_UpsampleBy2(samplesOut, outLen, tmp, (int32_t*) state2_);
            outLen = outLen * 2;
            // 4:12
            for (size_t i = 0; i < outLen; i += 160) {
              // WebRtcSpl_Resample16khzTo48khz() takes a block of 160 samples
              // as input and outputs a resampled block of 480 samples. The
              // data is now actually in 32 kHz sampling rate, despite the
              // function name, and with a resampling factor of three becomes
              // 96 kHz.
              WebRtcSpl_Resample16khzTo48khz(tmp + i, samplesOut + i * 3,
                                             (WebRtcSpl_State16khzTo48khz*) state3_,
                                             tmp_mem);
            }
            outLen = outLen * 3;
            free(tmp_mem);
            free(tmp);

            return 0;
        case kResamplerMode2To3:
            if (maxLen < (lengthIn * 3 / 2))
            {
                return -1;
            }
            // 2:6
            // We can only handle blocks of 160 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 160) != 0)
            {
                return -1;
            }
            tmp = static_cast<int16_t*> (malloc(sizeof(int16_t) * lengthIn * 3));
            tmp_mem = (int32_t*)malloc(336 * sizeof(int32_t));
            for (size_t i = 0; i < lengthIn; i += 160)
            {
                WebRtcSpl_Resample16khzTo48khz(samplesIn + i, tmp + i * 3,
                                               (WebRtcSpl_State16khzTo48khz *)state1_,
                                               tmp_mem);
            }
            lengthIn = lengthIn * 3;
            // 6:3
            WebRtcSpl_DownsampleBy2(tmp, lengthIn, samplesOut, (int32_t*)state2_);
            outLen = lengthIn / 2;
            free(tmp);
            free(tmp_mem);
            return 0;
        case kResamplerMode2To11:

            // We can only handle blocks of 80 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 80) != 0)
            {
                return -1;
            }
            if (maxLen < ((lengthIn * 11) / 2))
            {
                return -1;
            }
            tmp = (int16_t*)malloc(sizeof(int16_t) * 2 * lengthIn);
            // 1:2
            WebRtcSpl_UpsampleBy2(samplesIn, lengthIn, tmp, (int32_t*)state1_);
            lengthIn *= 2;

            tmp_mem = (int32_t*)malloc(98 * sizeof(int32_t));

            for (size_t i = 0; i < lengthIn; i += 80)
            {
                WebRtcSpl_Resample8khzTo22khz(tmp + i, samplesOut + (i * 11) / 4,
                                              (WebRtcSpl_State8khzTo22khz *)state2_,
                                              tmp_mem);
            }
            outLen = (lengthIn * 11) / 4;
            free(tmp_mem);
            free(tmp);
            return 0;
        case kResamplerMode4To11:

            // We can only handle blocks of 80 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 80) != 0)
            {
                return -1;
            }
            if (maxLen < ((lengthIn * 11) / 4))
            {
                return -1;
            }
            tmp_mem = (int32_t*)malloc(98 * sizeof(int32_t));

            for (size_t i = 0; i < lengthIn; i += 80)
            {
                WebRtcSpl_Resample8khzTo22khz(samplesIn + i, samplesOut + (i * 11) / 4,
                                              (WebRtcSpl_State8khzTo22khz *)state1_,
                                              tmp_mem);
            }
            outLen = (lengthIn * 11) / 4;
            free(tmp_mem);
            return 0;
        case kResamplerMode8To11:
            // We can only handle blocks of 160 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 160) != 0)
            {
                return -1;
            }
            if (maxLen < ((lengthIn * 11) / 8))
            {
                return -1;
            }
            tmp_mem = (int32_t*)malloc(88 * sizeof(int32_t));

            for (size_t i = 0; i < lengthIn; i += 160)
            {
                WebRtcSpl_Resample16khzTo22khz(samplesIn + i, samplesOut + (i * 11) / 8,
                                               (WebRtcSpl_State16khzTo22khz *)state1_,
                                               tmp_mem);
            }
            outLen = (lengthIn * 11) / 8;
            free(tmp_mem);
            return 0;

        case kResamplerMode11To16:
            // We can only handle blocks of 110 samples
            if ((lengthIn % 110) != 0)
            {
                return -1;
            }
            if (maxLen < ((lengthIn * 16) / 11))
            {
                return -1;
            }

            tmp_mem = (int32_t*)malloc(104 * sizeof(int32_t));
            tmp = (int16_t*)malloc((sizeof(int16_t) * lengthIn * 2));

            WebRtcSpl_UpsampleBy2(samplesIn, lengthIn, tmp, (int32_t*)state1_);

            for (size_t i = 0; i < (lengthIn * 2); i += 220)
            {
                WebRtcSpl_Resample22khzTo16khz(tmp + i, samplesOut + (i / 220) * 160,
                                               (WebRtcSpl_State22khzTo16khz *)state2_,
                                               tmp_mem);
            }

            outLen = (lengthIn * 16) / 11;

            free(tmp_mem);
            free(tmp);
            return 0;

        case kResamplerMode11To32:

            // We can only handle blocks of 110 samples
            if ((lengthIn % 110) != 0)
            {
                return -1;
            }
            if (maxLen < ((lengthIn * 32) / 11))
            {
                return -1;
            }

            tmp_mem = (int32_t*)malloc(104 * sizeof(int32_t));
            tmp = (int16_t*)malloc((sizeof(int16_t) * lengthIn * 2));

            // 11 -> 22 kHz in samplesOut
            WebRtcSpl_UpsampleBy2(samplesIn, lengthIn, samplesOut, (int32_t*)state1_);

            // 22 -> 16 in tmp
            for (size_t i = 0; i < (lengthIn * 2); i += 220)
            {
                WebRtcSpl_Resample22khzTo16khz(samplesOut + i, tmp + (i / 220) * 160,
                                               (WebRtcSpl_State22khzTo16khz *)state2_,
                                               tmp_mem);
            }

            // 16 -> 32 in samplesOut
            WebRtcSpl_UpsampleBy2(tmp, (lengthIn * 16) / 11, samplesOut,
                                  (int32_t*)state3_);

            outLen = (lengthIn * 32) / 11;

            free(tmp_mem);
            free(tmp);
            return 0;

        case kResamplerMode2To1:
            if (maxLen < (lengthIn / 2))
            {
                return -1;
            }
            WebRtcSpl_DownsampleBy2(samplesIn, lengthIn, samplesOut, (int32_t*)state1_);
            outLen = lengthIn / 2;
            return 0;
        case kResamplerMode3To1:
            // We can only handle blocks of 480 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 480) != 0)
            {
                return -1;
            }
            if (maxLen < (lengthIn / 3))
            {
                return -1;
            }
            tmp_mem = (int32_t*)malloc(496 * sizeof(int32_t));

            for (size_t i = 0; i < lengthIn; i += 480)
            {
                WebRtcSpl_Resample48khzTo16khz(samplesIn + i, samplesOut + i / 3,
                                               (WebRtcSpl_State48khzTo16khz *)state1_,
                                               tmp_mem);
            }
            outLen = lengthIn / 3;
            free(tmp_mem);
            return 0;
        case kResamplerMode4To1:
            if (maxLen < (lengthIn / 4))
            {
                return -1;
            }
            tmp = (int16_t*)malloc(sizeof(int16_t) * lengthIn / 2);
            // 4:2
            WebRtcSpl_DownsampleBy2(samplesIn, lengthIn, tmp, (int32_t*)state1_);
            // 2:1
            WebRtcSpl_DownsampleBy2(tmp, lengthIn / 2, samplesOut, (int32_t*)state2_);
            outLen = lengthIn / 4;
            free(tmp);
            return 0;

        case kResamplerMode6To1:
            // We can only handle blocks of 480 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 480) != 0)
            {
                return -1;
            }
            if (maxLen < (lengthIn / 6))
            {
                return -1;
            }

            tmp_mem = (int32_t*)malloc(496 * sizeof(int32_t));
            tmp = (int16_t*)malloc((sizeof(int16_t) * lengthIn) / 3);

            for (size_t i = 0; i < lengthIn; i += 480)
            {
                WebRtcSpl_Resample48khzTo16khz(samplesIn + i, tmp + i / 3,
                                               (WebRtcSpl_State48khzTo16khz *)state1_,
                                               tmp_mem);
            }
            outLen = lengthIn / 3;
            free(tmp_mem);
            WebRtcSpl_DownsampleBy2(tmp, outLen, samplesOut, (int32_t*)state2_);
            free(tmp);
            outLen = outLen / 2;
            return 0;
        case kResamplerMode12To1:
            // We can only handle blocks of 480 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 480) != 0) {
              return -1;
            }
            if (maxLen < (lengthIn / 12)) {
              return -1;
            }

            tmp_mem = (int32_t*) malloc(496 * sizeof(int32_t));
            tmp = (int16_t*) malloc((sizeof(int16_t) * lengthIn) / 3);
            tmp_2 = (int16_t*) malloc((sizeof(int16_t) * lengthIn) / 6);
            // 12:4
            for (size_t i = 0; i < lengthIn; i += 480) {
              // WebRtcSpl_Resample48khzTo16khz() takes a block of 480 samples
              // as input and outputs a resampled block of 160 samples. The
              // data is now actually in 96 kHz sampling rate, despite the
              // function name, and with a resampling factor of 1/3 becomes
              // 32 kHz.
              WebRtcSpl_Resample48khzTo16khz(samplesIn + i, tmp + i / 3,
                                             (WebRtcSpl_State48khzTo16khz*) state1_,
                                             tmp_mem);
            }
            outLen = lengthIn / 3;
            free(tmp_mem);
            // 4:2
            WebRtcSpl_DownsampleBy2(tmp, outLen, tmp_2, (int32_t*) state2_);
            outLen = outLen / 2;
            free(tmp);
            // 2:1
            WebRtcSpl_DownsampleBy2(tmp_2, outLen, samplesOut,
                                    (int32_t*) state3_);
            free(tmp_2);
            outLen = outLen / 2;
            return 0;
        case kResamplerMode3To2:
            if (maxLen < (lengthIn * 2 / 3))
            {
                return -1;
            }
            // 3:6
            tmp = static_cast<int16_t*> (malloc(sizeof(int16_t) * lengthIn * 2));
            WebRtcSpl_UpsampleBy2(samplesIn, lengthIn, tmp, (int32_t*)state1_);
            lengthIn *= 2;
            // 6:2
            // We can only handle blocks of 480 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 480) != 0)
            {
                free(tmp);
                return -1;
            }
            tmp_mem = (int32_t*)malloc(496 * sizeof(int32_t));
            for (size_t i = 0; i < lengthIn; i += 480)
            {
                WebRtcSpl_Resample48khzTo16khz(tmp + i, samplesOut + i / 3,
                                               (WebRtcSpl_State48khzTo16khz *)state2_,
                                               tmp_mem);
            }
            outLen = lengthIn / 3;
            free(tmp);
            free(tmp_mem);
            return 0;
        case kResamplerMode11To2:
            // We can only handle blocks of 220 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 220) != 0)
            {
                return -1;
            }
            if (maxLen < ((lengthIn * 2) / 11))
            {
                return -1;
            }
            tmp_mem = (int32_t*)malloc(126 * sizeof(int32_t));
            tmp = (int16_t*)malloc((lengthIn * 4) / 11 * sizeof(int16_t));

            for (size_t i = 0; i < lengthIn; i += 220)
            {
                WebRtcSpl_Resample22khzTo8khz(samplesIn + i, tmp + (i * 4) / 11,
                                              (WebRtcSpl_State22khzTo8khz *)state1_,
                                              tmp_mem);
            }
            lengthIn = (lengthIn * 4) / 11;

            WebRtcSpl_DownsampleBy2(tmp, lengthIn, samplesOut,
                                    (int32_t*)state2_);
            outLen = lengthIn / 2;

            free(tmp_mem);
            free(tmp);
            return 0;
        case kResamplerMode11To4:
            // We can only handle blocks of 220 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 220) != 0)
            {
                return -1;
            }
            if (maxLen < ((lengthIn * 4) / 11))
            {
                return -1;
            }
            tmp_mem = (int32_t*)malloc(126 * sizeof(int32_t));

            for (size_t i = 0; i < lengthIn; i += 220)
            {
                WebRtcSpl_Resample22khzTo8khz(samplesIn + i, samplesOut + (i * 4) / 11,
                                              (WebRtcSpl_State22khzTo8khz *)state1_,
                                              tmp_mem);
            }
            outLen = (lengthIn * 4) / 11;
            free(tmp_mem);
            return 0;
        case kResamplerMode11To8:
            // We can only handle blocks of 160 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 220) != 0)
            {
                return -1;
            }
            if (maxLen < ((lengthIn * 8) / 11))
            {
                return -1;
            }
            tmp_mem = (int32_t*)malloc(104 * sizeof(int32_t));

            for (size_t i = 0; i < lengthIn; i += 220)
            {
                WebRtcSpl_Resample22khzTo16khz(samplesIn + i, samplesOut + (i * 8) / 11,
                                               (WebRtcSpl_State22khzTo16khz *)state1_,
                                               tmp_mem);
            }
            outLen = (lengthIn * 8) / 11;
            free(tmp_mem);
            return 0;
            break;

    }
    return 0;
}